

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CoverpointSymbol *symbol)

{
  bool bVar1;
  long in_RSI;
  CoverageOptionSetter *option;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range2;
  CoverpointSymbol *in_stack_00000050;
  CoverageOptionSetter *in_stack_00000090;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  CoverpointSymbol *in_stack_ffffffffffffffd0;
  DiagnosticVisitor *in_stack_ffffffffffffffd8;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = handleDefault<slang::ast::CoverpointSymbol>
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    CoverpointSymbol::getIffExpr(in_stack_00000050);
    CoverpointSymbol::checkBins((CoverpointSymbol *)__end2._M_current);
    local_18 = local_10 + 0xb8;
    local_20._M_current =
         (CoverageOptionSetter *)
         std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffffc8);
    std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::end
              ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
               in_stack_ffffffffffffffd8);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffd0 =
           (CoverpointSymbol *)
           __gnu_cxx::
           __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
           ::operator*(&local_20);
      CoverageOptionSetter::getExpression(in_stack_00000090);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void handle(const CoverpointSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        symbol.getIffExpr();
        symbol.checkBins();
        for (auto& option : symbol.options)
            option.getExpression();
    }